

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg * __thiscall
fmt::v6::
basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
::get<char>(format_arg *__return_storage_ptr__,
           basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
           *this,basic_string_view<char> name)

{
  basic_string_view<char> rhs;
  bool bVar1;
  value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *local_70;
  basic_string_view<char> local_40;
  ulong local_30;
  size_t i;
  named_arg_value<char> *named_args;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *this_local;
  basic_string_view<char> name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                *)name.data_;
  named_args = (named_arg_value<char> *)this;
  bVar1 = has_named_args(this);
  if (bVar1) {
    bVar1 = is_packed(this);
    if (bVar1) {
      local_70 = (this->field_1).values_ + -1;
    }
    else {
      local_70 = (this->field_1).values_ + -2;
    }
    i = (size_t)local_70;
    for (local_30 = 0; local_30 < *(ulong *)(i + 8); local_30 = local_30 + 1) {
      basic_string_view<char>::basic_string_view(&local_40,*(char **)(*(long *)i + local_30 * 0x10))
      ;
      rhs.size_ = (size_t)name_local.data_;
      rhs.data_ = (char *)this_local;
      bVar1 = operator==(local_40,rhs);
      if (bVar1) {
        get(__return_storage_ptr__,this,*(int *)(*(long *)i + local_30 * 0x10 + 8));
        return __return_storage_ptr__;
      }
    }
    basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
    ::basic_format_arg(__return_storage_ptr__);
  }
  else {
    basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
    ::basic_format_arg(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

format_arg get(basic_string_view<Char> name) const {
    if (!has_named_args()) return {};
    const auto& named_args =
        (is_packed() ? values_[-1] : args_[-1].value_).named_args;
    for (size_t i = 0; i < named_args.size; ++i) {
      if (named_args.data[i].name == name) return get(named_args.data[i].id);
    }
    return {};
  }